

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.cc
# Opt level: O3

attribute_keys_map_t * tchecker::syncprod::system_t::known_attributes_abi_cxx11_(void)

{
  int iVar1;
  void *in_RSI;
  attribute_keys_map_t *__return_storage_ptr__;
  
  if (known_attributes[abi:cxx11]()::known_attr_abi_cxx11_ == '\0') {
    __return_storage_ptr__ =
         (attribute_keys_map_t *)&known_attributes[abi:cxx11]()::known_attr_abi_cxx11_;
    iVar1 = __cxa_guard_acquire();
    if (iVar1 != 0) {
      known_attributes[abi:cxx11]()::$_0::operator()[abi_cxx11_(__return_storage_ptr__,in_RSI);
      __cxa_atexit(std::
                   array<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_8UL>
                   ::~array,&known_attributes[abi:cxx11]()::known_attr_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&known_attributes[abi:cxx11]()::known_attr_abi_cxx11_);
    }
  }
  return &known_attributes[abi:cxx11]()::known_attr_abi_cxx11_;
}

Assistant:

tchecker::system::attribute_keys_map_t const & system_t::known_attributes()
{
  static tchecker::system::attribute_keys_map_t const known_attr{[&]() {
    tchecker::system::attribute_keys_map_t attr(tchecker::system::system_t::known_attributes());
    attr[tchecker::system::ATTR_LOCATION].insert("committed");
    attr[tchecker::system::ATTR_LOCATION].insert("labels");
    return attr;
  }()};
  return known_attr;
}